

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Typer.hpp
# Opt level: O0

void __thiscall
Utility::TypeRecipient<Electron::CharacterMapper>::typer_reset
          (TypeRecipient<Electron::CharacterMapper> *this,Typer *param_1)

{
  Typer *param_1_local;
  TypeRecipient<Electron::CharacterMapper> *this_local;
  
  (*(this->super_Delegate).super_KeyActions._vptr_KeyActions[1])();
  std::unique_ptr<Utility::Typer,_std::default_delete<Utility::Typer>_>::operator=
            (&this->previous_typer_,&this->typer_);
  std::unique_ptr<Utility::Typer,_std::default_delete<Utility::Typer>_>::operator=
            (&this->typer_,(nullptr_t)0x0);
  return;
}

Assistant:

void typer_reset(Typer *) override {
			clear_all_keys();

			// It's unsafe to deallocate typer right now, since it is the caller, but also it has a small
			// memory footprint and it's desireable not to imply that the subclass need call it any more.
			// So shuffle it off into a siding.
			previous_typer_ = std::move(typer_);
			typer_ = nullptr;
		}